

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O1

void FAudioFXVolumeMeter_Process
               (FAudioFXVolumeMeter *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  
  plVar2 = (long *)FAPOBase_BeginProcess(&fapo->base);
  if (fapo->channels != 0) {
    uVar4 = 0;
    do {
      if (pInputProcessParameters->ValidFrameCount == 0) {
        fVar8 = 0.0;
        fVar6 = 0.0;
        uVar1 = 0;
      }
      else {
        pfVar5 = (float *)(uVar4 * 4 + (long)pInputProcessParameters->pBuffer);
        uVar3 = 0;
        fVar8 = 0.0;
        fVar9 = 0.0;
        do {
          fVar6 = (float)SDL_fabsf(*pfVar5);
          if (fVar6 <= fVar9) {
            fVar6 = fVar9;
          }
          fVar8 = fVar8 + *pfVar5 * *pfVar5;
          uVar3 = uVar3 + 1;
          pfVar5 = pfVar5 + fapo->channels;
          uVar1 = pInputProcessParameters->ValidFrameCount;
          fVar9 = fVar6;
        } while (uVar3 < uVar1);
      }
      *(float *)(*plVar2 + uVar4 * 4) = fVar6;
      uVar7 = SDL_sqrtf(fVar8 / (float)uVar1);
      *(undefined4 *)(plVar2[1] + uVar4 * 4) = uVar7;
      uVar4 = uVar4 + 1;
    } while (uVar4 < fapo->channels);
  }
  FAPOBase_EndProcess(&fapo->base);
  return;
}

Assistant:

void FAudioFXVolumeMeter_Process(
	FAudioFXVolumeMeter *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	float peak;
	float total;
	float *buffer;
	uint32_t i, j;
	FAudioFXVolumeMeterLevels *levels = (FAudioFXVolumeMeterLevels*)
		FAPOBase_BeginProcess(&fapo->base);

	/* TODO: This could probably be SIMD-ified... */
	for (i = 0; i < fapo->channels; i += 1)
	{
		peak = 0.0f;
		total = 0.0f;
		buffer = ((float*) pInputProcessParameters->pBuffer) + i;
		for (j = 0; j < pInputProcessParameters->ValidFrameCount; j += 1, buffer += fapo->channels)
		{
			const float sampleAbs = FAudio_fabsf(*buffer);
			if (sampleAbs > peak)
			{
				peak = sampleAbs;
			}
			total += (*buffer) * (*buffer);
		}
		levels->pPeakLevels[i] = peak;
		levels->pRMSLevels[i] = FAudio_sqrtf(
			total / pInputProcessParameters->ValidFrameCount
		);
	}

	FAPOBase_EndProcess(&fapo->base);
}